

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_uc * stbi__tga_load(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  uchar uVar1;
  bool bVar2;
  byte bVar3;
  stbi_uc sVar4;
  int iVar5;
  uchar *puVar6;
  uint *in_RCX;
  int *in_RDX;
  int *in_RSI;
  uint in_R8D;
  uchar temp_1;
  uchar *tga_pixel;
  uchar temp;
  int index2;
  int index1;
  int pal_idx;
  int RLE_cmd;
  stbi_uc *tga_row;
  int y_1;
  int read_next_pixel;
  int RLE_repeating;
  int RLE_count;
  uchar raw_data [4];
  int j;
  int i;
  uchar *tga_palette;
  uchar *tga_data;
  int tga_inverted;
  int tga_comp;
  int tga_bits_per_pixel;
  int tga_height;
  int tga_width;
  int tga_y_origin;
  int tga_x_origin;
  int tga_palette_bits;
  int tga_palette_len;
  int tga_palette_start;
  int tga_is_RLE;
  int tga_image_type;
  int tga_indexed;
  int tga_offset;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  stbi__context *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  int local_b0;
  int local_ac;
  uint in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff5c;
  uchar *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int local_8c;
  int local_88;
  stbi_uc asStack_84 [4];
  int local_80;
  int local_7c;
  void *local_78;
  uchar *local_70;
  int local_64;
  uint local_60;
  uint local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  uint local_48;
  int local_44;
  int local_40;
  int local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint *local_28;
  int *local_20;
  int *local_18;
  uchar *local_8;
  
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  bVar3 = stbi__get8((stbi__context *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
  ;
  local_30 = (uint)bVar3;
  bVar3 = stbi__get8((stbi__context *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
  ;
  local_34 = (uint)bVar3;
  bVar3 = stbi__get8((stbi__context *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
  ;
  local_38 = (uint)bVar3;
  local_3c = 0;
  local_40 = stbi__get16le(in_stack_ffffffffffffff40);
  local_44 = stbi__get16le(in_stack_ffffffffffffff40);
  bVar3 = stbi__get8((stbi__context *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
  ;
  local_48 = (uint)bVar3;
  local_4c = stbi__get16le(in_stack_ffffffffffffff40);
  local_50 = stbi__get16le(in_stack_ffffffffffffff40);
  local_54 = stbi__get16le(in_stack_ffffffffffffff40);
  local_58 = stbi__get16le(in_stack_ffffffffffffff40);
  bVar3 = stbi__get8((stbi__context *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
  ;
  local_5c = (uint)bVar3;
  local_60 = local_5c / 8;
  bVar3 = stbi__get8((stbi__context *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
  ;
  local_78 = (void *)0x0;
  local_88 = 0;
  local_8c = 0;
  bVar2 = true;
  if (7 < (int)local_38) {
    local_38 = local_38 - 8;
    local_3c = 1;
  }
  local_64 = 1 - ((int)(uint)bVar3 >> 5 & 1U);
  if (((((local_54 < 1) || (local_58 < 1)) || ((int)local_38 < 1)) || (3 < (int)local_38)) ||
     (((local_5c != 8 && (local_5c != 0x10)) && ((local_5c != 0x18 && (local_5c != 0x20)))))) {
    local_8 = (uchar *)0x0;
  }
  else {
    if (local_34 != 0) {
      local_60 = (int)local_48 / 8;
    }
    *local_18 = local_54;
    *local_20 = local_58;
    if (local_28 != (uint *)0x0) {
      *local_28 = local_60;
    }
    local_70 = (uchar *)stbi__malloc(0x1157f3);
    if (local_70 == (uchar *)0x0) {
      stbi__err("outofmem");
      local_8 = (uchar *)0x0;
    }
    else {
      stbi__skip(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      if ((local_34 == 0) && (local_3c == 0)) {
        for (local_7c = 0; local_7c < local_58; local_7c = local_7c + 1) {
          in_stack_ffffffffffffff6c = local_7c;
          if (local_64 != 0) {
            in_stack_ffffffffffffff6c = (local_58 - local_7c) + -1;
          }
          in_stack_ffffffffffffff60 =
               local_70 + (int)(in_stack_ffffffffffffff6c * local_54 * local_60);
          stbi__getn((stbi__context *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                     (stbi_uc *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
        }
      }
      else {
        if (local_34 != 0) {
          stbi__skip(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
          local_78 = stbi__malloc(0x115917);
          if (local_78 == (void *)0x0) {
            free(local_70);
            stbi__err("outofmem");
            return (stbi_uc *)0x0;
          }
          iVar5 = stbi__getn((stbi__context *)
                             CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                             (stbi_uc *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
          if (iVar5 == 0) {
            free(local_70);
            free(local_78);
            stbi__err("bad palette");
            return (stbi_uc *)0x0;
          }
        }
        for (local_7c = 0; local_7c < local_54 * local_58; local_7c = local_7c + 1) {
          if (local_3c == 0) {
            bVar2 = true;
          }
          else if (local_88 == 0) {
            bVar3 = stbi__get8((stbi__context *)
                               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
            in_stack_ffffffffffffff5c = (uint)bVar3;
            local_88 = (in_stack_ffffffffffffff5c & 0x7f) + 1;
            local_8c = (int)in_stack_ffffffffffffff5c >> 7;
            bVar2 = true;
          }
          else if (local_8c == 0) {
            bVar2 = true;
          }
          if (bVar2) {
            if (local_34 == 0) {
              for (local_80 = 0; local_80 * 8 < (int)local_5c; local_80 = local_80 + 1) {
                sVar4 = stbi__get8((stbi__context *)
                                   CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
                asStack_84[local_80] = sVar4;
              }
            }
            else {
              bVar3 = stbi__get8((stbi__context *)
                                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
              in_stack_ffffffffffffff58 = (uint)bVar3;
              if (local_44 <= (int)in_stack_ffffffffffffff58) {
                in_stack_ffffffffffffff58 = 0;
              }
              in_stack_ffffffffffffff58 = ((int)local_5c / 8) * in_stack_ffffffffffffff58;
              for (local_80 = 0; local_80 * 8 < (int)local_5c; local_80 = local_80 + 1) {
                asStack_84[local_80] =
                     *(stbi_uc *)
                      ((long)local_78 + (long)(int)(in_stack_ffffffffffffff58 + local_80));
              }
            }
            bVar2 = false;
          }
          for (local_80 = 0; local_80 < (int)local_60; local_80 = local_80 + 1) {
            local_70[(int)(local_7c * local_60 + local_80)] = asStack_84[local_80];
          }
          local_88 = local_88 + -1;
        }
        if (local_64 != 0) {
          for (local_80 = 0; local_80 * 2 < local_58; local_80 = local_80 + 1) {
            local_ac = local_80 * local_54 * local_60;
            local_b0 = ((local_58 + -1) - local_80) * local_54 * local_60;
            for (local_7c = local_54 * local_60; 0 < local_7c; local_7c = local_7c + -1) {
              uVar1 = local_70[local_ac];
              local_70[local_ac] = local_70[local_b0];
              local_70[local_b0] = uVar1;
              local_ac = local_ac + 1;
              local_b0 = local_b0 + 1;
            }
          }
        }
        if (local_78 != (void *)0x0) {
          free(local_78);
        }
      }
      if (2 < (int)local_60) {
        puVar6 = local_70;
        for (local_7c = 0; local_7c < local_54 * local_58; local_7c = local_7c + 1) {
          uVar1 = *puVar6;
          *puVar6 = puVar6[2];
          puVar6[2] = uVar1;
          puVar6 = puVar6 + (int)local_60;
        }
      }
      if ((local_2c != 0) && (local_2c != local_60)) {
        local_70 = stbi__convert_format
                             ((uchar *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                              ,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                              (int)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                              in_stack_ffffffffffffff58);
      }
      local_8 = local_70;
    }
  }
  return local_8;
}

Assistant:

static stbi_uc *stbi__tga_load(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   //   read in the TGA header stuff
   int tga_offset = stbi__get8(s);
   int tga_indexed = stbi__get8(s);
   int tga_image_type = stbi__get8(s);
   int tga_is_RLE = 0;
   int tga_palette_start = stbi__get16le(s);
   int tga_palette_len = stbi__get16le(s);
   int tga_palette_bits = stbi__get8(s);
   int tga_x_origin = stbi__get16le(s);
   int tga_y_origin = stbi__get16le(s);
   int tga_width = stbi__get16le(s);
   int tga_height = stbi__get16le(s);
   int tga_bits_per_pixel = stbi__get8(s);
   int tga_comp = tga_bits_per_pixel / 8;
   int tga_inverted = stbi__get8(s);
   //   image data
   unsigned char *tga_data;
   unsigned char *tga_palette = NULL;
   int i, j;
   unsigned char raw_data[4];
   int RLE_count = 0;
   int RLE_repeating = 0;
   int read_next_pixel = 1;

   //   do a tiny bit of precessing
   if ( tga_image_type >= 8 )
   {
      tga_image_type -= 8;
      tga_is_RLE = 1;
   }
   /* int tga_alpha_bits = tga_inverted & 15; */
   tga_inverted = 1 - ((tga_inverted >> 5) & 1);

   //   error check
   if ( //(tga_indexed) ||
      (tga_width < 1) || (tga_height < 1) ||
      (tga_image_type < 1) || (tga_image_type > 3) ||
      ((tga_bits_per_pixel != 8) && (tga_bits_per_pixel != 16) &&
      (tga_bits_per_pixel != 24) && (tga_bits_per_pixel != 32))
      )
   {
      return NULL; // we don't report this as a bad TGA because we don't even know if it's TGA
   }

   //   If I'm paletted, then I'll use the number of bits from the palette
   if ( tga_indexed )
   {
      tga_comp = tga_palette_bits / 8;
   }

   //   tga info
   *x = tga_width;
   *y = tga_height;
   if (comp) *comp = tga_comp;

   tga_data = (unsigned char*)stbi__malloc( (size_t)tga_width * tga_height * tga_comp );
   if (!tga_data) return stbi__errpuc("outofmem", "Out of memory");

   // skip to the data's starting position (offset usually = 0)
   stbi__skip(s, tga_offset );

   if ( !tga_indexed && !tga_is_RLE) {
      for (i=0; i < tga_height; ++i) {
         int y = tga_inverted ? tga_height -i - 1 : i;
         stbi_uc *tga_row = tga_data + y*tga_width*tga_comp;
         stbi__getn(s, tga_row, tga_width * tga_comp);
      }
   } else  {
      //   do I need to load a palette?
      if ( tga_indexed)
      {
         //   any data to skip? (offset usually = 0)
         stbi__skip(s, tga_palette_start );
         //   load the palette
         tga_palette = (unsigned char*)stbi__malloc( tga_palette_len * tga_palette_bits / 8 );
         if (!tga_palette) {
            STBI_FREE(tga_data);
            return stbi__errpuc("outofmem", "Out of memory");
         }
         if (!stbi__getn(s, tga_palette, tga_palette_len * tga_palette_bits / 8 )) {
            STBI_FREE(tga_data);
            STBI_FREE(tga_palette);
            return stbi__errpuc("bad palette", "Corrupt TGA");
         }
      }
      //   load the data
      for (i=0; i < tga_width * tga_height; ++i)
      {
         //   if I'm in RLE mode, do I need to get a RLE stbi__pngchunk?
         if ( tga_is_RLE )
         {
            if ( RLE_count == 0 )
            {
               //   yep, get the next byte as a RLE command
               int RLE_cmd = stbi__get8(s);
               RLE_count = 1 + (RLE_cmd & 127);
               RLE_repeating = RLE_cmd >> 7;
               read_next_pixel = 1;
            } else if ( !RLE_repeating )
            {
               read_next_pixel = 1;
            }
         } else
         {
            read_next_pixel = 1;
         }
         //   OK, if I need to read a pixel, do it now
         if ( read_next_pixel )
         {
            //   load however much data we did have
            if ( tga_indexed )
            {
               //   read in 1 byte, then perform the lookup
               int pal_idx = stbi__get8(s);
               if ( pal_idx >= tga_palette_len )
               {
                  //   invalid index
                  pal_idx = 0;
               }
               pal_idx *= tga_bits_per_pixel / 8;
               for (j = 0; j*8 < tga_bits_per_pixel; ++j)
               {
                  raw_data[j] = tga_palette[pal_idx+j];
               }
            } else
            {
               //   read in the data raw
               for (j = 0; j*8 < tga_bits_per_pixel; ++j)
               {
                  raw_data[j] = stbi__get8(s);
               }
            }
            //   clear the reading flag for the next pixel
            read_next_pixel = 0;
         } // end of reading a pixel

         // copy data
         for (j = 0; j < tga_comp; ++j)
           tga_data[i*tga_comp+j] = raw_data[j];

         //   in case we're in RLE mode, keep counting down
         --RLE_count;
      }
      //   do I need to invert the image?
      if ( tga_inverted )
      {
         for (j = 0; j*2 < tga_height; ++j)
         {
            int index1 = j * tga_width * tga_comp;
            int index2 = (tga_height - 1 - j) * tga_width * tga_comp;
            for (i = tga_width * tga_comp; i > 0; --i)
            {
               unsigned char temp = tga_data[index1];
               tga_data[index1] = tga_data[index2];
               tga_data[index2] = temp;
               ++index1;
               ++index2;
            }
         }
      }
      //   clear my palette, if I had one
      if ( tga_palette != NULL )
      {
         STBI_FREE( tga_palette );
      }
   }

   // swap RGB
   if (tga_comp >= 3)
   {
      unsigned char* tga_pixel = tga_data;
      for (i=0; i < tga_width * tga_height; ++i)
      {
         unsigned char temp = tga_pixel[0];
         tga_pixel[0] = tga_pixel[2];
         tga_pixel[2] = temp;
         tga_pixel += tga_comp;
      }
   }

   // convert to target component count
   if (req_comp && req_comp != tga_comp)
      tga_data = stbi__convert_format(tga_data, tga_comp, req_comp, tga_width, tga_height);

   //   the things I do to get rid of an error message, and yet keep
   //   Microsoft's C compilers happy... [8^(
   tga_palette_start = tga_palette_len = tga_palette_bits =
         tga_x_origin = tga_y_origin = 0;
   //   OK, done
   return tga_data;
}